

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

TokenType __thiscall wabt::WastParser::Peek(WastParser *this,size_t n)

{
  Token local_78;
  
  if ((this->tokens_).size_ <= n) {
    do {
      WastLexer::GetToken(&local_78,this->lexer_,this);
      CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,&local_78);
      Token::~Token(&local_78);
    } while ((this->tokens_).size_ <= n);
  }
  return *(TokenType *)
          ((long)&(this->tokens_).contents_._M_elems[0].token_type_ +
          (ulong)(((int)n + (int)(this->tokens_).front_ & 1U) * 0x50));
}

Assistant:

TokenType WastParser::Peek(size_t n) {
  while (tokens_.size() <= n)
    tokens_.push_back(lexer_->GetToken(this));
  return tokens_.at(n).token_type();
}